

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethernet.cpp
# Opt level: O3

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::Ethernet::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,Ethernet *this)

{
  ulong uVar1;
  bool bVar2;
  iterator iVar3;
  FUNCTION_RETURN FVar4;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy;
  ulong uVar5;
  long lVar6;
  uchar *puVar7;
  uchar uVar8;
  uchar *puVar9;
  uchar *puVar10;
  uchar *puVar11;
  uchar *puVar12;
  iterator __begin2;
  _Type auVar13;
  array<unsigned_char,_7UL> *data_00;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> data;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapters;
  uchar auStack_49a [1018];
  undefined8 uStack_a0;
  array<unsigned_char,_7UL> local_8f;
  array<unsigned_char,_7UL> *local_88;
  iterator iStack_80;
  array<unsigned_char,_7UL> *local_78;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> local_68;
  Ethernet *local_48;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *local_40;
  _Type local_38;
  
  local_78 = (array<unsigned_char,_7UL> *)0x0;
  local_88 = (array<unsigned_char,_7UL> *)0x0;
  iStack_80._M_current = (array<unsigned_char,_7UL> *)0x0;
  bVar2 = this->use_ip;
  local_68.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_a0 = 0x19f8f2;
  FVar4 = os::getAdapterInfos(&local_68);
  if (FVar4 == FUNC_RET_OK) {
    local_38 = (_Type)local_68.
                      super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (local_68.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar1 = (ulong)(bVar2 ^ 1) * 2 + 4;
      puVar10 = (uchar *)((long)local_68.
                                super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x406);
      puVar12 = (uchar *)((long)local_68.
                                super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x40c);
      auVar13 = (_Type)local_68.
                       super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      local_48 = this;
      local_40 = __return_storage_ptr__;
      do {
        local_8f._M_elems[5] = '\0';
        local_8f._M_elems[6] = '\0';
        local_8f._M_elems[1] = '\0';
        local_8f._M_elems[2] = '\0';
        local_8f._M_elems[3] = '\0';
        local_8f._M_elems[4] = '\0';
        uVar5 = 1;
        puVar7 = puVar12;
        puVar9 = puVar10;
        do {
          puVar11 = puVar9;
          if (bVar2 != false) {
            puVar11 = puVar7;
          }
          if (uVar1 <= uVar5) break;
          uVar5 = uVar5 + 1;
          puVar9 = puVar9 + 1;
          puVar7 = puVar7 + 1;
        } while (*puVar11 == '\0');
        if (*puVar11 != '\0') {
          lVar6 = 0x40c;
          puVar7 = puVar10;
          do {
            uVar8 = '*';
            if (lVar6 - 0x40cU < uVar1) {
              puVar9 = puVar7 + 6;
              if (bVar2 == false) {
                puVar9 = puVar7;
              }
              uVar8 = *puVar9;
            }
            auStack_49a[lVar6] = uVar8;
            lVar6 = lVar6 + 1;
            puVar7 = puVar7 + 1;
          } while (lVar6 != 0x412);
          local_8f._M_elems[0] = '\0';
          if (iStack_80._M_current == local_78) {
            uStack_a0 = 0x19f9ec;
            std::vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
            ::_M_realloc_insert<std::array<unsigned_char,7ul>const&>
                      ((vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
                        *)&local_88,iStack_80,&local_8f);
          }
          else {
            *(uint *)((iStack_80._M_current)->_M_elems + 3) =
                 CONCAT22(local_8f._M_elems._5_2_,
                          CONCAT11(local_8f._M_elems[4],local_8f._M_elems[3]));
            *(uint *)(iStack_80._M_current)->_M_elems =
                 (uint)CONCAT12(local_8f._M_elems[3],local_8f._M_elems._1_2_) << 8;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
        auVar13 = (_Type)((long)auVar13 + 0x414);
        puVar10 = puVar10 + 0x414;
        puVar12 = puVar12 + 0x414;
      } while (auVar13 != local_38);
      bVar2 = true;
      this = local_48;
      __return_storage_ptr__ = local_40;
      goto LAB_0019fa11;
    }
  }
  bVar2 = false;
LAB_0019fa11:
  if ((_Type)local_68.
             super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start != (_Type)0x0) {
    uStack_a0 = 0x19fa1e;
    operator_delete(local_68.
                    super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar2) {
    uStack_a0 = 0x19fa54;
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::reserve(__return_storage_ptr__,
              ((long)iStack_80._M_current - (long)local_88) * 0x6db6db6db6db6db7);
    iVar3._M_current = (array<unsigned_char,_7UL> *)iStack_80;
    if (local_88 != iStack_80._M_current) {
      data_00 = local_88;
      do {
        uStack_a0 = 0x19fa70;
        HwIdentifier::HwIdentifier((HwIdentifier *)&local_68);
        uStack_a0 = 0x19fa7a;
        strategy = (*(this->super_IdentificationStrategy)._vptr_IdentificationStrategy[2])(this);
        uStack_a0 = 0x19fa84;
        HwIdentifier::set_identification_strategy((HwIdentifier *)&local_68,strategy);
        uStack_a0 = 0x19fa8f;
        HwIdentifier::set_data((HwIdentifier *)&local_68,data_00);
        uStack_a0 = 0x19fa9a;
        std::
        vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ::push_back(__return_storage_ptr__,(HwIdentifier *)&local_68);
        uStack_a0 = 0x19faa2;
        HwIdentifier::~HwIdentifier((HwIdentifier *)&local_68);
        data_00 = data_00 + 1;
      } while (data_00 != iVar3._M_current);
    }
  }
  if (local_88 != (array<unsigned_char,_7UL> *)0x0) {
    uStack_a0 = 0x19fabd;
    operator_delete(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HwIdentifier> Ethernet::alternative_ids() const {
	vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> data;
	FUNCTION_RETURN result = generate_ethernet_pc_id(data, use_ip);
	vector<HwIdentifier> identifiers;
	if (result == FUNC_RET_OK) {
		identifiers.reserve(data.size());
		for (auto &it : data) {
			HwIdentifier pc_id;
			pc_id.set_identification_strategy(identification_strategy());
			pc_id.set_data(it);
			identifiers.push_back(pc_id);
		}
	}
	return identifiers;
}